

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
          (void *this,Symbol *a,FullNameQuery *b)

{
  bool bVar1;
  string_view __x;
  
  __x = Symbol::full_name((Symbol *)this);
  bVar1 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)a);
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.full_name() == b.full_name();
  }